

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedenums.cpp
# Opt level: O0

void __thiscall OutputFile::OutputFile(OutputFile *this,string *filepath)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  undefined8 uVar3;
  bool bVar4;
  char *local_440;
  char *cp;
  char line [1024];
  FILE *readhandle;
  string *filepath_local;
  OutputFile *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->_filepath,(string *)filepath);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar2,"r");
  if (__stream != (FILE *)0x0) {
    pcVar2 = fgets((char *)&cp,0x400,__stream);
    if (pcVar2 == (char *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      Error("I/O error while reading %s",uVar3);
    }
    iVar1 = strncmp((char *)&cp,"// ",3);
    if (iVar1 == 0) {
      local_440 = (char *)((long)&cp + 3);
      while( true ) {
        bVar4 = false;
        if (*local_440 != '\0') {
          bVar4 = *local_440 != '\n';
        }
        if (!bVar4) break;
        local_440 = local_440 + 1;
      }
      *local_440 = '\0';
    }
    fclose(__stream);
  }
  return;
}

Assistant:

OutputFile (string const& filepath) :
		_filepath (filepath)
	{
		FILE* readhandle = fopen (_filepath.c_str(), "r");

		if (readhandle)
		{
			char line[1024];

			if (fgets (line, sizeof line, readhandle) == null)
				Error ("I/O error while reading %s", _filepath.c_str());

			if (strncmp (line, "// ", 3) == 0)
			{
				// Get rid of the newline at the end
				char* cp;
				for (cp = &line[3]; *cp != '\0' and *cp != '\n'; ++cp)
					;

				*cp = '\0';
			}

			fclose (readhandle);
		}
	}